

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

ValueCallback * __thiscall
SNMPAgent::addDynamicIntegerHandler
          (SNMPAgent *this,char *oid,GETINT_FUNC callback_func,bool overwritePrefix)

{
  SortableOIDType *oid_00;
  DynamicIntegerCallback *this_00;
  SortableOIDType *oidType;
  bool overwritePrefix_local;
  GETINT_FUNC callback_func_local;
  char *oid_local;
  SNMPAgent *this_local;
  
  if (callback_func == (GETINT_FUNC)0x0) {
    this_local = (SNMPAgent *)0x0;
  }
  else {
    oid_00 = buildOIDWithPrefix(this,oid,overwritePrefix);
    if (oid_00 == (SortableOIDType *)0x0) {
      this_local = (SNMPAgent *)0x0;
    }
    else {
      this_00 = (DynamicIntegerCallback *)operator_new(0x20);
      DynamicIntegerCallback::DynamicIntegerCallback(this_00,oid_00,callback_func);
      this_local = (SNMPAgent *)addHandler(this,(ValueCallback *)this_00,false);
    }
  }
  return (ValueCallback *)this_local;
}

Assistant:

ValueCallback* SNMPAgent::addDynamicIntegerHandler(const char *oid, GETINT_FUNC callback_func, bool overwritePrefix){
    if(!callback_func) {
        return nullptr;
    }

    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) {
        return nullptr;
    }

    return addHandler(new DynamicIntegerCallback(oidType, callback_func), false);
}